

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_> * __thiscall
kj::_::ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>::
operator=(ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
          *this,ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
                *param_1)

{
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)this,(Maybe<kj::Exception> *)param_1);
  Maybe<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>::operator=
            (&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;